

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeImports(WasmBinaryWriter *this)

{
  pointer puVar1;
  Function *import_00;
  BufferWithRandomAccess *pBVar2;
  pointer puVar3;
  Global *import_01;
  pointer puVar4;
  Tag *import_02;
  pointer puVar5;
  Memory *import_03;
  Address AVar6;
  pointer puVar7;
  Table *import_04;
  U32LEB UVar8;
  int32_t start;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *import_2;
  pointer puVar13;
  anon_class_8_1_8991fb9c local_38;
  anon_class_8_1_8991fb9c writeImportHeader;
  
  UVar8.value = ImportInfo::getNumImports
                          ((this->importInfo)._M_t.
                           super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>
                           .super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl);
  if (UVar8.value != 0) {
    start = startSection<wasm::BinaryConsts::Section>(this,Import);
    BufferWithRandomAccess::operator<<(this->o,UVar8);
    puVar1 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38.this = this;
    for (puVar9 = (this->wasm->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1)
    {
      import_00 = (puVar9->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(import_00->super_Importable).module + 8) != (char *)0x0) {
        writeImports::anon_class_8_1_8991fb9c::operator()(&local_38,&import_00->super_Importable);
        BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x0);
        pBVar2 = this->o;
        UVar8.value = getTypeIndex(this,(HeapType)(import_00->type).id);
        BufferWithRandomAccess::operator<<(pBVar2,UVar8);
      }
    }
    puVar3 = (this->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (this->wasm->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
        puVar10 = puVar10 + 1) {
      import_01 = (puVar10->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(import_01->super_Importable).module + 8) != (char *)0x0) {
        writeImports::anon_class_8_1_8991fb9c::operator()(&local_38,&import_01->super_Importable);
        BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x3);
        writeType(this,(Type)(import_01->type).id);
        UVar8.value._1_3_ = 0;
        UVar8.value._0_1_ = import_01->mutable_;
        BufferWithRandomAccess::operator<<(this->o,UVar8);
      }
    }
    puVar4 = (this->wasm->tags).
             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = (this->wasm->tags).
                   super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar4;
        puVar13 = puVar13 + 1) {
      import_02 = (puVar13->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                  _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      if (*(char **)((long)&(import_02->super_Importable).module + 8) != (char *)0x0) {
        writeImports::anon_class_8_1_8991fb9c::operator()(&local_38,&import_02->super_Importable);
        BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x4);
        BufferWithRandomAccess::operator<<(this->o,'\0');
        pBVar2 = this->o;
        UVar8.value = getTypeIndex(this,(HeapType)(import_02->type).id);
        BufferWithRandomAccess::operator<<(pBVar2,UVar8);
      }
    }
    puVar5 = (this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (this->wasm->memories).
                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar5;
        puVar11 = puVar11 + 1) {
      import_03 = (puVar11->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      if (*(char **)((long)&(import_03->super_Importable).module + 8) != (char *)0x0) {
        writeImports::anon_class_8_1_8991fb9c::operator()(&local_38,&import_03->super_Importable);
        BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x2);
        AVar6.addr = (import_03->max).addr;
        writeResizableLimits
                  (this,(Address)(import_03->initial).addr,AVar6,AVar6.addr != 0xffffffffffffffff,
                   import_03->shared,(import_03->addressType).id == 3);
      }
    }
    puVar7 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (this->wasm->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar7;
        puVar12 = puVar12 + 1) {
      import_04 = (puVar12->_M_t).
                  super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      if (*(char **)((long)&(import_04->super_Importable).module + 8) != (char *)0x0) {
        writeImports::anon_class_8_1_8991fb9c::operator()(&local_38,&import_04->super_Importable);
        BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x1);
        writeType(this,(Type)(import_04->type).id);
        AVar6.addr = (import_04->max).addr;
        writeResizableLimits
                  (this,(Address)(import_04->initial).addr,AVar6,AVar6.addr != 0xffffffff,false,
                   (import_04->addressType).id == 3);
      }
    }
    finishSection(this,start);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeImports() {
  auto num = importInfo->getNumImports();
  if (num == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Import);
  o << U32LEB(num);
  auto writeImportHeader = [&](Importable* import) {
    writeInlineString(import->module.str);
    writeInlineString(import->base.str);
  };
  ModuleUtils::iterImportedFunctions(*wasm, [&](Function* func) {
    writeImportHeader(func);
    o << U32LEB(int32_t(ExternalKind::Function));
    o << U32LEB(getTypeIndex(func->type));
  });
  ModuleUtils::iterImportedGlobals(*wasm, [&](Global* global) {
    writeImportHeader(global);
    o << U32LEB(int32_t(ExternalKind::Global));
    writeType(global->type);
    o << U32LEB(global->mutable_);
  });
  ModuleUtils::iterImportedTags(*wasm, [&](Tag* tag) {
    writeImportHeader(tag);
    o << U32LEB(int32_t(ExternalKind::Tag));
    o << uint8_t(0); // Reserved 'attribute' field. Always 0.
    o << U32LEB(getTypeIndex(tag->type));
  });
  ModuleUtils::iterImportedMemories(*wasm, [&](Memory* memory) {
    writeImportHeader(memory);
    o << U32LEB(int32_t(ExternalKind::Memory));
    writeResizableLimits(memory->initial,
                         memory->max,
                         memory->hasMax(),
                         memory->shared,
                         memory->is64());
  });
  ModuleUtils::iterImportedTables(*wasm, [&](Table* table) {
    writeImportHeader(table);
    o << U32LEB(int32_t(ExternalKind::Table));
    writeType(table->type);
    writeResizableLimits(table->initial,
                         table->max,
                         table->hasMax(),
                         /*shared=*/false,
                         table->is64());
  });
  finishSection(start);
}